

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O0

void __thiscall QMimeAllGlobPatterns::removeMimeType(QMimeAllGlobPatterns *this,QString *mimeType)

{
  long lVar1;
  QStringView mimeType_00;
  QStringView mimeType_01;
  bool bVar2;
  storage_type_conflict *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *x;
  PatternsMap *__range1;
  iterator __end1;
  iterator __begin1;
  QString *in_stack_ffffffffffffff78;
  QList<QString> *in_stack_ffffffffffffff80;
  QString *in_stack_ffffffffffffff88;
  QHash<QString,_QList<QString>_> *in_stack_ffffffffffffff98;
  QStringView *pQVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  QHash<QString,_QList<QString>_>::begin(in_stack_ffffffffffffff98);
  QHash<QString,_QList<QString>_>::end((QHash<QString,_QList<QString>_> *)in_stack_ffffffffffffff88)
  ;
  while( true ) {
    bVar2 = QHash<QString,_QList<QString>_>::iterator::operator!=
                      ((iterator *)in_stack_ffffffffffffff88,(iterator *)in_stack_ffffffffffffff80);
    if (!bVar2) break;
    QHash<QString,_QList<QString>_>::iterator::operator*((iterator *)0x8ee46a);
    QList<QString>::removeAll<QString>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QHash<QString,_QList<QString>_>::iterator::operator++((iterator *)in_RDI);
  }
  QStringView::QStringView<QString,_true>(in_RDI,in_stack_ffffffffffffff88);
  mimeType_00.m_data = in_RSI;
  mimeType_00.m_size = (qsizetype)pQVar3;
  QMimeGlobPatternList::removeMimeType
            ((QMimeGlobPatternList *)in_stack_ffffffffffffff78,mimeType_00);
  QStringView::QStringView<QString,_true>(in_RDI,(QString *)(in_RDI + 2));
  mimeType_01.m_data = in_RSI;
  mimeType_01.m_size = (qsizetype)pQVar3;
  QMimeGlobPatternList::removeMimeType
            ((QMimeGlobPatternList *)in_stack_ffffffffffffff78,mimeType_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeAllGlobPatterns::removeMimeType(const QString &mimeType)
{
    for (auto &x : m_fastPatterns)
        x.removeAll(mimeType);
    m_highWeightGlobs.removeMimeType(mimeType);
    m_lowWeightGlobs.removeMimeType(mimeType);
}